

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int optimize_scope_make_global_ref
              (JSContext *ctx,JSFunctionDef *s,DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next
              ,JSAtom var_name)

{
  byte bVar1;
  int iVar2;
  JSAtomStruct *pJVar3;
  int iVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  JSAtom local_38;
  JSAtom local_34;
  
  if (((ulong)s & 1) != 0) {
    dbuf_putc(bc,'6');
    if (0xd1 < (int)var_name) {
      pJVar3 = ctx->rt->atom_array[var_name];
      (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
    }
    local_38 = var_name;
    dbuf_put(bc,(uint8_t *)&local_38,4);
  }
  if (bc_buf[pos_next] == '<') {
    dbuf_putc(bc,'8');
    if (0xd1 < (int)var_name) {
      pJVar3 = ctx->rt->atom_array[var_name];
      (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
    }
    local_34 = var_name;
    dbuf_put(bc,(uint8_t *)&local_34,4);
    pos_next = pos_next + 1;
  }
  iVar2 = ls->pos;
  uVar5 = (long)iVar2 - 5;
  bVar1 = bc_buf[iVar2];
  if (((ulong)s & 1) == 0) {
    uVar6 = '9';
    uVar8 = '\x11';
    uVar7 = '9';
    if (bVar1 != 0x16) goto LAB_0015e327;
  }
  else {
    uVar7 = ';';
    uVar6 = ';';
    if (bVar1 < 0x1d) {
      uVar8 = '\x15';
      if (bVar1 != 0x16) {
        if (bVar1 != 0x19) {
LAB_0015e318:
          abort();
        }
        uVar8 = '\x18';
      }
    }
    else {
      if (bVar1 != 0x1d) {
        if (bVar1 != 0xb1) goto LAB_0015e318;
        goto LAB_0015e327;
      }
      uVar8 = '\x1b';
    }
  }
  uVar6 = uVar7;
  bc_buf[uVar5] = uVar8;
  uVar5 = (ulong)(iVar2 - 4);
LAB_0015e327:
  iVar4 = (int)uVar5;
  bc_buf[iVar4] = uVar6;
  if (0xd1 < (int)var_name) {
    pJVar3 = ctx->rt->atom_array[var_name];
    (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
  }
  *(JSAtom *)(bc_buf + (long)iVar4 + 1) = var_name;
  if (iVar4 + 3 < iVar2) {
    memset(bc_buf + (long)iVar4 + 5,0xb1,(ulong)((iVar2 - iVar4) - 4) + 1);
  }
  return pos_next;
}

Assistant:

static int optimize_scope_make_global_ref(JSContext *ctx, JSFunctionDef *s,
                                          DynBuf *bc, uint8_t *bc_buf,
                                          LabelSlot *ls, int pos_next,
                                          JSAtom var_name)
{
    int label_pos, end_pos, pos, op;
    BOOL is_strict;
    is_strict = ((s->js_mode & JS_MODE_STRICT) != 0);

    /* replace the reference get/put with normal variable
       accesses */
    if (is_strict) {
        /* need to check if the variable exists before evaluating the right
           expression */
        /* XXX: need an extra OP_true if destructuring an array */
        dbuf_putc(bc, OP_check_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
    } else {
        /* XXX: need 2 extra OP_true if destructuring an array */
    }
    if (bc_buf[pos_next] == OP_get_ref_value) {
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        pos_next++;
    }
    /* remove the OP_label to make room for replacement */
    /* label should have a refcount of 0 anyway */
    /* XXX: should have emitted several OP_nop to avoid this kludge */
    label_pos = ls->pos;
    pos = label_pos - 5;
    assert(bc_buf[pos] == OP_label);
    end_pos = label_pos + 2;
    op = bc_buf[label_pos];
    if (is_strict) {
        if (op != OP_nop) {
            switch(op) {
            case OP_insert3:
                op = OP_insert2;
                break;
            case OP_perm4:
                op = OP_perm3;
                break;
            case OP_rot3l:
                op = OP_swap;
                break;
            default:
                abort();
            }
            bc_buf[pos++] = op;
        }
    } else {
        if (op == OP_insert3)
            bc_buf[pos++] = OP_dup;
    }
    if (is_strict) {
        bc_buf[pos] = OP_put_var_strict;
        /* XXX: need 1 extra OP_drop if destructuring an array */
    } else {
        bc_buf[pos] = OP_put_var;
        /* XXX: need 2 extra OP_drop if destructuring an array */
    }
    put_u32(bc_buf + pos + 1, JS_DupAtom(ctx, var_name));
    pos += 5;
    /* pad with OP_nop */
    while (pos < end_pos)
        bc_buf[pos++] = OP_nop;
    return pos_next;
}